

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.cpp
# Opt level: O3

void Kumu::GenRandomUUID(byte_t *buf)

{
  FortunaRNG RNG;
  FortunaRNG local_11;
  
  FortunaRNG::FortunaRNG(&local_11);
  FortunaRNG::FillRandom(&local_11,buf,0x10);
  buf[6] = buf[6] & 0xf | 0x40;
  buf[8] = buf[8] & 0x3f | 0x80;
  FortunaRNG::~FortunaRNG(&local_11);
  return;
}

Assistant:

void
Kumu::GenRandomUUID(byte_t* buf)
{
  FortunaRNG RNG;
  RNG.FillRandom(buf, UUID_Length);
  buf[6] &= 0x0f; // clear bits 4-7
  buf[6] |= 0x40; // set UUID version
  buf[8] &= 0x3f; // clear bits 6&7
  buf[8] |= 0x80; // set bit 7
}